

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
CivetServer::getListeningPorts
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,CivetServer *this)

{
  pointer piVar1;
  int *piVar2;
  ulong uVar3;
  vector<mg_server_port,_std::allocator<mg_server_port>_> server_ports;
  allocator_type local_29;
  _Vector_base<mg_server_port,_std::allocator<mg_server_port>_> local_28;
  
  getListeningPortsFull((vector<mg_server_port,_std::allocator<mg_server_port>_> *)&local_28,this);
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)local_28._M_impl.super__Vector_impl_data._M_finish -
             (long)local_28._M_impl.super__Vector_impl_data._M_start >> 5,&local_29);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = &(local_28._M_impl.super__Vector_impl_data._M_start)->port;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)local_28._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_28._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar3 = uVar3 + 1) {
    piVar1[uVar3] = *piVar2;
    piVar2 = piVar2 + 8;
  }
  std::_Vector_base<mg_server_port,_std::allocator<mg_server_port>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
CivetServer::getListeningPorts()
{
	std::vector<struct mg_server_port> server_ports = getListeningPortsFull();

	std::vector<int> ports(server_ports.size());
	for (size_t i = 0; i < server_ports.size(); i++) {
		ports[i] = server_ports[i].port;
	}

	return ports;
}